

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void buf2buf(size_t chunksize_src,void *buf_src,size_t chunksize_dst,void *buf_dst)

{
  size_t __n;
  
  __n = chunksize_dst - chunksize_src;
  if (__n != 0) {
    if (chunksize_dst < chunksize_src) {
      buf_src = (void *)((long)buf_src + (chunksize_src - chunksize_dst));
    }
    else {
      memset(buf_dst,0,__n);
      buf_dst = (void *)((long)buf_dst + __n);
      chunksize_dst = chunksize_src;
    }
  }
  memcpy(buf_dst,buf_src,chunksize_dst);
  return;
}

Assistant:

void buf2buf(size_t chunksize_src, void *buf_src,
             size_t chunksize_dst, void *buf_dst)
{
    if (chunksize_dst == chunksize_src) {
        memcpy(buf_dst, buf_src, chunksize_src);
    } else if (chunksize_dst < chunksize_src) {
        memcpy(buf_dst, (uint8_t*)buf_src + (chunksize_src - chunksize_dst),
               chunksize_dst);
    } else { // chunksize_dst > chunksize_src
        memset(buf_dst, 0x0, chunksize_dst - chunksize_src);
        memcpy((uint8_t*)buf_dst + (chunksize_dst - chunksize_src),
               buf_src, chunksize_src);
    }
}